

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcTiming.c
# Opt level: O0

int Abc_NtkDelayTraceCritPath_rec
              (Vec_Int_t *vSlacks,Abc_Obj_t *pNode,Abc_Obj_t *pLeaf,Vec_Int_t *vBest)

{
  int iVar1;
  uint uVar2;
  Abc_Obj_t *pNode_00;
  float fVar3;
  bool local_49;
  int local_48;
  float local_44;
  int i;
  float SlackMin;
  Abc_Obj_t *pFaninBest;
  Abc_Obj_t *pFanin;
  Vec_Int_t *vBest_local;
  Abc_Obj_t *pLeaf_local;
  Abc_Obj_t *pNode_local;
  Vec_Int_t *vSlacks_local;
  
  _i = (Abc_Obj_t *)0x0;
  local_44 = 1e+09;
  iVar1 = Abc_ObjIsCi(pNode);
  if (iVar1 == 0) {
    iVar1 = Abc_ObjIsNode(pNode);
    if (iVar1 == 0) {
      __assert_fail("Abc_ObjIsNode(pNode)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcTiming.c"
                    ,0x349,
                    "int Abc_NtkDelayTraceCritPath_rec(Vec_Int_t *, Abc_Obj_t *, Abc_Obj_t *, Vec_Int_t *)"
                   );
    }
    iVar1 = Abc_NodeIsTravIdCurrent(pNode);
    if (iVar1 == 0) {
      Abc_NodeSetTravIdCurrent(pNode);
      iVar1 = Abc_ObjIsNode(pNode);
      if (iVar1 == 0) {
        __assert_fail("Abc_ObjIsNode(pNode)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcTiming.c"
                      ,0x34f,
                      "int Abc_NtkDelayTraceCritPath_rec(Vec_Int_t *, Abc_Obj_t *, Abc_Obj_t *, Vec_Int_t *)"
                     );
      }
      for (local_48 = 0; iVar1 = Abc_ObjFaninNum(pNode), local_48 < iVar1; local_48 = local_48 + 1)
      {
        pNode_00 = Abc_ObjFanin(pNode,local_48);
        iVar1 = Abc_NtkDelayTraceCritPath_rec(vSlacks,pNode_00,pLeaf,vBest);
        if ((iVar1 != 0) &&
           ((_i == (Abc_Obj_t *)0x0 ||
            (fVar3 = Abc_NtkDelayTraceSlack(vSlacks,pNode,local_48), fVar3 < local_44)))) {
          local_44 = Abc_NtkDelayTraceSlack(vSlacks,pNode,local_48);
          _i = pNode_00;
        }
      }
      if (_i != (Abc_Obj_t *)0x0) {
        uVar2 = Abc_ObjId(pNode);
        iVar1 = Abc_NodeFindFanin(pNode,_i);
        Vec_IntWriteEntry(vBest,uVar2,iVar1);
      }
      vSlacks_local._4_4_ = (uint)(_i != (Abc_Obj_t *)0x0);
    }
    else {
      uVar2 = Abc_ObjId(pNode);
      iVar1 = Vec_IntEntry(vBest,uVar2);
      vSlacks_local._4_4_ = (uint)(-1 < iVar1);
    }
  }
  else {
    local_49 = pLeaf == (Abc_Obj_t *)0x0 || pLeaf == pNode;
    vSlacks_local._4_4_ = (uint)local_49;
  }
  return vSlacks_local._4_4_;
}

Assistant:

int Abc_NtkDelayTraceCritPath_rec( Vec_Int_t * vSlacks, Abc_Obj_t * pNode, Abc_Obj_t * pLeaf, Vec_Int_t * vBest )
{
    Abc_Obj_t * pFanin, * pFaninBest = NULL;
    float SlackMin = ABC_INFINITY;  int i;
    // check primary inputs
    if ( Abc_ObjIsCi(pNode) )
        return (pLeaf == NULL || pLeaf == pNode);
    assert( Abc_ObjIsNode(pNode) );
    // check visited
    if ( Abc_NodeIsTravIdCurrent( pNode ) )
        return Vec_IntEntry(vBest, Abc_ObjId(pNode)) >= 0;
    Abc_NodeSetTravIdCurrent( pNode );
    // check the node
    assert( Abc_ObjIsNode(pNode) );
    Abc_ObjForEachFanin( pNode, pFanin, i )
    {
        if ( !Abc_NtkDelayTraceCritPath_rec( vSlacks, pFanin, pLeaf, vBest ) )
            continue;
        if ( pFaninBest == NULL || SlackMin > Abc_NtkDelayTraceSlack(vSlacks, pNode, i) )
        {
            pFaninBest = pFanin;
            SlackMin = Abc_NtkDelayTraceSlack(vSlacks, pNode, i);
        }
    }
    if ( pFaninBest != NULL )
        Vec_IntWriteEntry( vBest, Abc_ObjId(pNode), Abc_NodeFindFanin(pNode, pFaninBest) );
    return (pFaninBest != NULL);
}